

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

bool __thiscall
capnp::compiler::ValueTranslator::matchesType
          (ValueTranslator *this,Reader src,Type type,Orphan<capnp::DynamicValue> *result)

{
  ErrorReporter *pEVar1;
  ulong uVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  Which WVar6;
  short sVar7;
  unsigned_short uVar8;
  Which WVar9;
  Type TVar10;
  int iVar11;
  uint uVar12;
  ReaderFor<long> RVar13;
  ReaderFor<unsigned_long> RVar14;
  ReaderFor<capnp::DynamicEnum> RVar15;
  bool local_3f1;
  bool local_3b1;
  Fault local_340;
  Fault f_1;
  Fault f;
  Reader local_328;
  ReaderFor<capnp::DynamicStruct> local_2e0;
  Schema local_2a8;
  Schema local_2a0;
  Schema local_298;
  uint16_t local_290;
  byte local_281;
  Reader local_280;
  DynamicEnum local_238;
  Schema local_228;
  Type local_220;
  Reader local_210;
  ReaderFor<capnp::DynamicList> local_1c8;
  Type local_188;
  Orphan<capnp::DynamicValue> local_178;
  ArrayPtr<const_char> local_140;
  Reader local_130;
  ulong local_e8;
  uint64_t maxValue;
  ArrayPtr<const_char> local_a8;
  ulong local_98;
  int64_t minValue;
  Reader local_80;
  ReaderFor<long> local_38;
  int64_t value;
  Orphan<capnp::DynamicValue> *result_local;
  ValueTranslator *this_local;
  Type type_local;
  
  type_local._0_8_ = type.field_4;
  this_local = type._0_8_;
  value = (int64_t)result;
  result_local = (Orphan<capnp::DynamicValue> *)this;
  TVar10 = Orphan<capnp::DynamicValue>::getType(result);
  switch(TVar10) {
  case UNKNOWN:
    kj::_::unreachable();
  case VOID:
    type_local.field_4.scopeId._7_1_ = capnp::Type::isVoid((Type *)&this_local);
    break;
  case BOOL:
    type_local.field_4.scopeId._7_1_ = capnp::Type::isBool((Type *)&this_local);
    break;
  case INT:
    Orphan<capnp::DynamicValue>::getReader(&local_80,(Orphan<capnp::DynamicValue> *)value);
    RVar13 = DynamicValue::Reader::as<long>(&local_80);
    DynamicValue::Reader::~Reader(&local_80);
    local_38 = RVar13;
    if (RVar13 < 0) {
      WVar6 = capnp::Type::which((Type *)&this_local);
      switch(WVar6) {
      case INT8:
        cVar3 = kj::MinValue_::operator_cast_to_signed_char((MinValue_ *)&kj::minValue);
        local_98 = (ulong)cVar3;
        break;
      case INT16:
        sVar7 = kj::MinValue_::operator_cast_to_short((MinValue_ *)&kj::minValue);
        local_98 = (ulong)sVar7;
        break;
      case INT32:
        iVar11 = kj::MinValue_::operator_cast_to_int((MinValue_ *)&kj::minValue);
        local_98 = (ulong)iVar11;
        break;
      case INT64:
        local_98 = kj::MinValue_::operator_cast_to_long((MinValue_ *)&kj::minValue);
        break;
      case UINT8:
        bVar4 = kj::MinValue_::operator_cast_to_unsigned_char((MinValue_ *)&kj::minValue);
        local_98 = (ulong)bVar4;
        break;
      case UINT16:
        uVar8 = kj::MinValue_::operator_cast_to_unsigned_short((MinValue_ *)&kj::minValue);
        local_98 = (ulong)uVar8;
        break;
      case UINT32:
        uVar12 = kj::MinValue_::operator_cast_to_unsigned_int((MinValue_ *)&kj::minValue);
        local_98 = (ulong)uVar12;
        break;
      case UINT64:
        local_98 = kj::MinValue_::operator_cast_to_unsigned_long((MinValue_ *)&kj::minValue);
        break;
      case FLOAT32:
      case FLOAT64:
        local_98 = kj::MinValue_::operator_cast_to_long((MinValue_ *)&kj::minValue);
        break;
      default:
        type_local.field_4.scopeId._7_1_ = 0;
        goto LAB_006b6bbf;
      }
      if (local_38 < (long)local_98) {
        pEVar1 = this->errorReporter;
        kj::StringPtr::StringPtr((StringPtr *)&local_a8,"Integer value out of range.");
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (pEVar1,&src,(StringPtr)local_a8);
        Orphan<capnp::DynamicValue>::Orphan((Orphan<capnp::DynamicValue> *)&maxValue,local_98);
        Orphan<capnp::DynamicValue>::operator=
                  ((Orphan<capnp::DynamicValue> *)value,(Orphan<capnp::DynamicValue> *)&maxValue);
        Orphan<capnp::DynamicValue>::~Orphan((Orphan<capnp::DynamicValue> *)&maxValue);
      }
      type_local.field_4.scopeId._7_1_ = 1;
      break;
    }
  case UINT:
    WVar6 = capnp::Type::which((Type *)&this_local);
    switch(WVar6) {
    case INT8:
      cVar3 = kj::MaxValue_::operator_cast_to_signed_char((MaxValue_ *)&kj::maxValue);
      local_e8 = (ulong)cVar3;
      break;
    case INT16:
      sVar7 = kj::MaxValue_::operator_cast_to_short((MaxValue_ *)&kj::maxValue);
      local_e8 = (ulong)sVar7;
      break;
    case INT32:
      iVar11 = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
      local_e8 = (ulong)iVar11;
      break;
    case INT64:
      local_e8 = kj::MaxValue_::operator_cast_to_long((MaxValue_ *)&kj::maxValue);
      break;
    case UINT8:
      bVar4 = kj::MaxValue_::operator_cast_to_unsigned_char((MaxValue_ *)&kj::maxValue);
      local_e8 = (ulong)bVar4;
      break;
    case UINT16:
      uVar8 = kj::MaxValue_::operator_cast_to_unsigned_short((MaxValue_ *)&kj::maxValue);
      local_e8 = (ulong)uVar8;
      break;
    case UINT32:
      uVar12 = kj::MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
      local_e8 = (ulong)uVar12;
      break;
    case UINT64:
      local_e8 = kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
      break;
    case FLOAT32:
    case FLOAT64:
      local_e8 = kj::MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&kj::maxValue);
      break;
    default:
      type_local.field_4.scopeId._7_1_ = 0;
      goto LAB_006b6bbf;
    }
    Orphan<capnp::DynamicValue>::getReader(&local_130,(Orphan<capnp::DynamicValue> *)value);
    RVar14 = DynamicValue::Reader::as<unsigned_long>(&local_130);
    uVar2 = local_e8;
    DynamicValue::Reader::~Reader(&local_130);
    if (uVar2 < RVar14) {
      pEVar1 = this->errorReporter;
      kj::StringPtr::StringPtr((StringPtr *)&local_140,"Integer value out of range.");
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (pEVar1,&src,(StringPtr)local_140);
      Orphan<capnp::DynamicValue>::Orphan(&local_178,local_e8);
      Orphan<capnp::DynamicValue>::operator=((Orphan<capnp::DynamicValue> *)value,&local_178);
      Orphan<capnp::DynamicValue>::~Orphan(&local_178);
    }
    type_local.field_4.scopeId._7_1_ = 1;
    break;
  case FLOAT:
    bVar5 = capnp::Type::isFloat32((Type *)&this_local);
    local_3b1 = true;
    if (!bVar5) {
      local_3b1 = capnp::Type::isFloat64((Type *)&this_local);
    }
    type_local.field_4.scopeId._7_1_ = local_3b1;
    break;
  case TEXT:
    type_local.field_4.scopeId._7_1_ = capnp::Type::isText((Type *)&this_local);
    break;
  case DATA:
    type_local.field_4.scopeId._7_1_ = capnp::Type::isData((Type *)&this_local);
    break;
  case LIST:
    bVar5 = capnp::Type::isList((Type *)&this_local);
    if (bVar5) {
      Orphan<capnp::DynamicValue>::getReader(&local_210,(Orphan<capnp::DynamicValue> *)value);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_1c8,&local_210);
      local_188 = (Type)DynamicList::Reader::getSchema(&local_1c8);
      local_220 = (Type)capnp::Type::asList((Type *)&this_local);
      type_local.field_4.scopeId._7_1_ =
           ListSchema::operator==((ListSchema *)&local_188,(ListSchema *)&local_220);
      DynamicValue::Reader::~Reader(&local_210);
    }
    else {
      bVar5 = capnp::Type::isAnyPointer((Type *)&this_local);
      if (bVar5) {
        WVar9 = capnp::Type::whichAnyPointerKind((Type *)&this_local);
        switch(WVar9) {
        case ANY_KIND:
        case LIST:
          type_local.field_4.scopeId._7_1_ = 1;
          break;
        case STRUCT:
        case CAPABILITY:
          type_local.field_4.scopeId._7_1_ = 0;
          break;
        default:
          kj::_::unreachable();
        }
      }
      else {
        type_local.field_4.scopeId._7_1_ = 0;
      }
    }
    break;
  case ENUM:
    bVar5 = capnp::Type::isEnum((Type *)&this_local);
    local_281 = 0;
    local_3f1 = false;
    if (bVar5) {
      Orphan<capnp::DynamicValue>::getReader(&local_280,(Orphan<capnp::DynamicValue> *)value);
      local_281 = 1;
      RVar15 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_280);
      local_298.raw = (RawBrandedSchema *)RVar15.schema.super_Schema.raw;
      local_290 = RVar15.value;
      local_238.schema.super_Schema.raw = (Schema)(Schema)local_298.raw;
      local_238.value = local_290;
      local_228.raw = (RawBrandedSchema *)DynamicEnum::getSchema(&local_238);
      local_2a0.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)&this_local);
      local_3f1 = Schema::operator==(&local_228,&local_2a0);
    }
    type_local.field_4.scopeId._7_1_ = local_3f1;
    if ((local_281 & 1) != 0) {
      DynamicValue::Reader::~Reader(&local_280);
    }
    break;
  case STRUCT:
    bVar5 = capnp::Type::isStruct((Type *)&this_local);
    if (bVar5) {
      Orphan<capnp::DynamicValue>::getReader(&local_328,(Orphan<capnp::DynamicValue> *)value);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2e0,&local_328);
      local_2a8.raw = (RawBrandedSchema *)DynamicStruct::Reader::getSchema(&local_2e0);
      f.exception = (Exception *)capnp::Type::asStruct((Type *)&this_local);
      type_local.field_4.scopeId._7_1_ = Schema::operator==(&local_2a8,(Schema *)&f);
      DynamicValue::Reader::~Reader(&local_328);
    }
    else {
      bVar5 = capnp::Type::isAnyPointer((Type *)&this_local);
      if (bVar5) {
        WVar9 = capnp::Type::whichAnyPointerKind((Type *)&this_local);
        if (WVar9 < LIST) {
          type_local.field_4.scopeId._7_1_ = 1;
        }
        else {
          if (1 < WVar9 - 2) {
            kj::_::unreachable();
          }
          type_local.field_4.scopeId._7_1_ = 0;
        }
      }
      else {
        type_local.field_4.scopeId._7_1_ = 0;
      }
    }
    break;
  case CAPABILITY:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&f_1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x7e7,FAILED,(char *)0x0,"\"Interfaces can\'t have literal values.\"",
               (char (*) [38])"Interfaces can\'t have literal values.");
    kj::_::Debug::Fault::fatal(&f_1);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x7ea,FAILED,(char *)0x0,"\"AnyPointers can\'t have literal values.\"",
               (char (*) [39])"AnyPointers can\'t have literal values.");
    kj::_::Debug::Fault::fatal(&local_340);
  default:
    kj::_::unreachable();
  }
LAB_006b6bbf:
  return (bool)(type_local.field_4.scopeId._7_1_ & 1);
}

Assistant:

bool ValueTranslator::matchesType(Expression::Reader src, Type type, Orphan<DynamicValue>& result) {
  // compileValueInner() evaluated `src` and only used `type` as a hint in interpreting `src` if
  // `src`'s type wasn't already obvious. So, now we need to check that the resulting value
  // actually matches `type`.

  switch (result.getType()) {
    case DynamicValue::UNKNOWN:
      KJ_UNREACHABLE;

    case DynamicValue::VOID:
      return type.isVoid();

    case DynamicValue::BOOL:
      return type.isBool();

    case DynamicValue::INT: {
      int64_t value = result.getReader().as<int64_t>();
      if (value < 0) {
        int64_t minValue;
        switch (type.which()) {
          case schema::Type::INT8: minValue = (int8_t)kj::minValue; break;
          case schema::Type::INT16: minValue = (int16_t)kj::minValue; break;
          case schema::Type::INT32: minValue = (int32_t)kj::minValue; break;
          case schema::Type::INT64: minValue = (int64_t)kj::minValue; break;
          case schema::Type::UINT8: minValue = (uint8_t)kj::minValue; break;
          case schema::Type::UINT16: minValue = (uint16_t)kj::minValue; break;
          case schema::Type::UINT32: minValue = (uint32_t)kj::minValue; break;
          case schema::Type::UINT64: minValue = (uint64_t)kj::minValue; break;

          case schema::Type::FLOAT32:
          case schema::Type::FLOAT64:
            // Any integer is acceptable.
            minValue = (int64_t)kj::minValue;
            break;

          default: return false;
        }

        if (value < minValue) {
          errorReporter.addErrorOn(src, "Integer value out of range.");
          result = minValue;
        }
        return true;
      }

    } KJ_FALLTHROUGH;  // value is positive, so we can just go on to the uint case below.

    case DynamicValue::UINT: {
      uint64_t maxValue;
      switch (type.which()) {
        case schema::Type::INT8: maxValue = (int8_t)kj::maxValue; break;
        case schema::Type::INT16: maxValue = (int16_t)kj::maxValue; break;
        case schema::Type::INT32: maxValue = (int32_t)kj::maxValue; break;
        case schema::Type::INT64: maxValue = (int64_t)kj::maxValue; break;
        case schema::Type::UINT8: maxValue = (uint8_t)kj::maxValue; break;
        case schema::Type::UINT16: maxValue = (uint16_t)kj::maxValue; break;
        case schema::Type::UINT32: maxValue = (uint32_t)kj::maxValue; break;
        case schema::Type::UINT64: maxValue = (uint64_t)kj::maxValue; break;

        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
          // Any integer is acceptable.
          maxValue = (uint64_t)kj::maxValue;
          break;

        default: return false;
      }

      if (result.getReader().as<uint64_t>() > maxValue) {
        errorReporter.addErrorOn(src, "Integer value out of range.");
        result = maxValue;
      }
      return true;
    }

    case DynamicValue::FLOAT:
      return type.isFloat32() || type.isFloat64();

    case DynamicValue::TEXT:
      return type.isText();

    case DynamicValue::DATA:
      return type.isData();

    case DynamicValue::LIST:
      if (type.isList()) {
        return result.getReader().as<DynamicList>().getSchema() == type.asList();
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::LIST:
            return true;
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            return false;
        }
        KJ_UNREACHABLE;
      } else {
        return false;
      }

    case DynamicValue::ENUM:
      return type.isEnum() &&
             result.getReader().as<DynamicEnum>().getSchema() == type.asEnum();

    case DynamicValue::STRUCT:
      if (type.isStruct()) {
        return result.getReader().as<DynamicStruct>().getSchema() == type.asStruct();
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
            return true;
          case schema::Type::AnyPointer::Unconstrained::LIST:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            return false;
        }
        KJ_UNREACHABLE;
      } else {
        return false;
      }

    case DynamicValue::CAPABILITY:
      KJ_FAIL_ASSERT("Interfaces can't have literal values.");

    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("AnyPointers can't have literal values.");
  }

  KJ_UNREACHABLE;
}